

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::appendData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLCh *dat,XMLSize_t n)

{
  bool bVar1;
  DOMNodeImpl *this_00;
  DOMException *this_01;
  MemoryManager *local_58;
  XMLSize_t n_local;
  XMLCh *dat_local;
  DOMNode *node_local;
  DOMCharacterDataImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(node);
  bVar1 = DOMNodeImpl::isReadOnly(this_00);
  if (!bVar1) {
    DOMBuffer::append(this->fDataBuf,dat,n);
    return;
  }
  this_01 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDoc == (DOMDocumentImpl *)0x0) {
    local_58 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    local_58 = DOMDocumentImpl::getMemoryManager(this->fDoc);
  }
  DOMException::DOMException(this_01,7,0,local_58);
  __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::appendData(const DOMNode *node, const  XMLCh *dat, XMLSize_t n)
{
    if(castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    fDataBuf->append(dat, n);
}